

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

bool __thiscall QPDFObjectHandle::getValueAsOperator(QPDFObjectHandle *this,string *value)

{
  bool bVar1;
  string local_38;
  
  bVar1 = isOperator(this);
  if (bVar1) {
    QPDFObject::getStringValue_abi_cxx11_
              (&local_38,
               (this->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__cxx11::string::operator=((string *)value,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::getValueAsOperator(std::string& value) const
{
    if (!isOperator()) {
        return false;
    }
    value = obj->getStringValue();
    return true;
}